

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine_const&>
          (QMovableArrayOps<QToolBarAreaLayoutLine> *this,qsizetype i,QToolBarAreaLayoutLine *args)

{
  QToolBarAreaLayoutLine **ppQVar1;
  qsizetype *pqVar2;
  Orientation OVar3;
  long lVar4;
  Data *pDVar5;
  long lVar6;
  Data *pDVar7;
  QToolBarAreaLayoutItem *pQVar8;
  qsizetype qVar9;
  QToolBarAreaLayoutLine *pQVar10;
  QToolBarAreaLayoutLine *pQVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
           super_QArrayDataPointer<QToolBarAreaLayoutLine>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004bc758:
    OVar3 = args->o;
    uVar15 = (args->rect).x1;
    uVar16 = (args->rect).y1;
    uVar17 = (args->rect).x2;
    uVar18 = (args->rect).y2;
    pDVar7 = (args->toolBarItems).d.d;
    pQVar8 = (args->toolBarItems).d.ptr;
    qVar9 = (args->toolBarItems).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar19 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
             super_QArrayDataPointer<QToolBarAreaLayoutLine>.size != 0;
    QArrayDataPointer<QToolBarAreaLayoutLine>::detachAndGrow
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)this,(uint)(i == 0 && bVar19),1,
               (QToolBarAreaLayoutLine **)0x0,(QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0);
    pQVar10 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
              super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
    if (i != 0 || !bVar19) {
      pQVar11 = pQVar10 + i;
      memmove(pQVar11 + 1,pQVar10 + i,
              ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
               super_QArrayDataPointer<QToolBarAreaLayoutLine>.size - i) * 0x30);
      (pQVar11->rect).x1.m_i = uVar15;
      (pQVar11->rect).y1.m_i = uVar16;
      (pQVar11->rect).x2.m_i = uVar17;
      (pQVar11->rect).y2.m_i = uVar18;
      pQVar11->o = OVar3;
      (pQVar11->toolBarItems).d.d = pDVar7;
      (pQVar11->toolBarItems).d.ptr = pQVar8;
      (pQVar11->toolBarItems).d.size = qVar9;
      goto LAB_004bc81a;
    }
    pQVar10[-1].o = OVar3;
    pQVar10[-1].rect.x1.m_i = uVar15;
    pQVar10[-1].rect.y1.m_i = uVar16;
    pQVar10[-1].rect.x2.m_i = uVar17;
    pQVar10[-1].rect.y2.m_i = uVar18;
    pQVar10[-1].toolBarItems.d.d = pDVar7;
    pQVar10[-1].toolBarItems.d.ptr = pQVar8;
    pQVar10[-1].toolBarItems.d.size = qVar9;
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
            super_QArrayDataPointer<QToolBarAreaLayoutLine>.size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                      super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pQVar11 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
      pQVar11[lVar6].o = args->o;
      iVar12 = (args->rect).y1.m_i;
      iVar13 = (args->rect).x2.m_i;
      iVar14 = (args->rect).y2.m_i;
      pQVar10 = pQVar11 + lVar6;
      (pQVar10->rect).x1.m_i = (args->rect).x1.m_i;
      (pQVar10->rect).y1.m_i = iVar12;
      (pQVar10->rect).x2.m_i = iVar13;
      (pQVar10->rect).y2.m_i = iVar14;
      pDVar7 = (args->toolBarItems).d.d;
      pQVar11[lVar6].toolBarItems.d.d = pDVar7;
      pQVar11[lVar6].toolBarItems.d.ptr = (args->toolBarItems).d.ptr;
      pQVar11[lVar6].toolBarItems.d.size = (args->toolBarItems).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_004bc81a;
    }
    if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
       ((QToolBarAreaLayoutLine *)
        ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
        super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr)) goto LAB_004bc758;
    pQVar10 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
              super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
    pQVar10[-1].o = args->o;
    iVar12 = (args->rect).y1.m_i;
    iVar13 = (args->rect).x2.m_i;
    iVar14 = (args->rect).y2.m_i;
    pQVar10[-1].rect.x1.m_i = (args->rect).x1.m_i;
    pQVar10[-1].rect.y1.m_i = iVar12;
    pQVar10[-1].rect.x2.m_i = iVar13;
    pQVar10[-1].rect.y2.m_i = iVar14;
    pDVar7 = (args->toolBarItems).d.d;
    pQVar10[-1].toolBarItems.d.d = pDVar7;
    pQVar10[-1].toolBarItems.d.ptr = (args->toolBarItems).d.ptr;
    pQVar10[-1].toolBarItems.d.size = (args->toolBarItems).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
             super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_004bc81a:
  pqVar2 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
            super_QArrayDataPointer<QToolBarAreaLayoutLine>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }